

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Str_t * Acb_GenerateInstance2(Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  int iVar1;
  Vec_Str_t *p;
  void *pvVar2;
  char *pcVar3;
  Vec_Str_t *vStr;
  int i;
  char *pName;
  Vec_Ptr_t *vOuts_local;
  Vec_Ptr_t *vIns_local;
  
  p = Vec_StrAlloc(100);
  Vec_StrAppend(p,"  patch p0 (");
  for (vStr._4_4_ = 0; iVar1 = Vec_PtrSize(vOuts), (int)vStr._4_4_ < iVar1;
      vStr._4_4_ = vStr._4_4_ + 1) {
    pvVar2 = Vec_PtrEntry(vOuts,vStr._4_4_);
    pcVar3 = "";
    if (vStr._4_4_ != 0) {
      pcVar3 = ",";
    }
    Vec_StrPrintF(p,"%s .%s(t%d_%s)",pcVar3,pvVar2,(ulong)vStr._4_4_,pvVar2);
  }
  for (vStr._4_4_ = 0; iVar1 = Vec_PtrSize(vIns), (int)vStr._4_4_ < iVar1;
      vStr._4_4_ = vStr._4_4_ + 1) {
    pvVar2 = Vec_PtrEntry(vIns,vStr._4_4_);
    Vec_StrPrintF(p,", .%s(%s)",pvVar2,pvVar2);
  }
  Vec_StrAppend(p," );\n\n");
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Acb_GenerateInstance2( Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    char * pName; int i;
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "  patch p0 (" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s .%s(t%d_%s)", i ? ",":"", pName, i, pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", .%s(%s)", pName, pName );
    Vec_StrAppend( vStr, " );\n\n" );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}